

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar2;
  DrawTest *pDVar3;
  long lVar4;
  TestNode *this_00;
  IndexType type;
  IndexType type_00;
  Storage storage;
  int *piVar5;
  undefined8 *puVar6;
  IndexTest *pIVar7;
  long lVar8;
  bool bVar9;
  allocator<char> local_211;
  TestNode *local_210;
  IndexTest *local_208;
  MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> test;
  string iterationDesc;
  string desc;
  string name;
  DrawTestSpec spec;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  IndexTest tests [5];
  
  puVar6 = &DAT_005cc320;
  pIVar7 = tests;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar6;
    pIVar7->storage = (int)uVar1;
    pIVar7->type = (int)((ulong)uVar1 >> 0x20);
    puVar6 = puVar6 + 1;
    pIVar7 = (IndexTest *)&pIVar7->aligned;
  }
  deqp::gls::DrawTestSpec::DrawTestSpec(&spec);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"user_ptr",
             "user pointer");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_user_ptr","unaligned user pointer");
  local_210 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_210,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "buffer");
  genBasicSpec(&spec,this->m_method);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,local_210);
  piVar5 = tests[0].offsets;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    bVar9 = tests[lVar4].aligned != false;
    pTVar2 = node_00;
    if (bVar9) {
      pTVar2 = node;
    }
    this_00 = (TestNode *)0x0;
    if (bVar9) {
      this_00 = local_210;
    }
    if (tests[lVar4].storage == STORAGE_USER) {
      this_00 = pTVar2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"index_",(allocator<char> *)&local_e8);
    local_208 = tests + lVar4;
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&iterationDesc,(DrawTestSpec *)(ulong)tests[lVar4].type,type);
    std::operator+(&name,&desc,&iterationDesc);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"index ",&local_211);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)&test,(DrawTestSpec *)(ulong)local_208->type,type_00);
    std::operator+(&local_e8,&local_108,(string *)&test);
    std::operator+(&iterationDesc,&local_e8," in ");
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              (&local_c8,(DrawTestSpec *)(ulong)local_208->storage,storage);
    std::operator+(&desc,&iterationDesc,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::~string((string *)&local_108);
    pDVar3 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (pDVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    spec.indexType = local_208->type;
    spec.indexStorage = local_208->storage;
    test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr
         = pDVar3;
    for (lVar8 = 0;
        (pDVar3 = test.
                  super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                  m_data.ptr, lVar8 != 0xc && (*(int *)((long)piVar5 + lVar8) != -1));
        lVar8 = lVar8 + 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"offset ",(allocator<char> *)&local_c8);
      de::toString<int>(&local_108,(int *)((long)piVar5 + lVar8));
      std::operator+(&iterationDesc,&local_e8,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      spec.indexPointerOffset = *(int *)((long)piVar5 + lVar8);
      deqp::gls::DrawTest::addIteration
                (test.
                 super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                 m_data.ptr,&spec,iterationDesc._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&iterationDesc);
    }
    test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr
         = (DrawTest *)0x0;
    tcu::TestNode::addChild(this_00,(TestNode *)pDVar3);
    de::details::UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::
    ~UniqueBase(&test.
                 super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    piVar5 = piVar5 + 6;
  }
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&spec.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },

		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },

		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* userPtrGroup			= new tcu::TestCaseGroup(m_testCtx, "user_ptr", "user pointer");
	tcu::TestCaseGroup* unalignedUserPtrGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_user_ptr", "unaligned user pointer");
	tcu::TestCaseGroup* bufferGroup				= new tcu::TestCaseGroup(m_testCtx, "buffer", "buffer");

	genBasicSpec(spec, m_method);

	this->addChild(userPtrGroup);
	this->addChild(unalignedUserPtrGroup);
	this->addChild(bufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];
		tcu::TestCaseGroup*				group		= (indexTest.storage == gls::DrawTestSpec::STORAGE_USER)
													? ((indexTest.aligned) ? (userPtrGroup) : (unalignedUserPtrGroup))
													: ((indexTest.aligned) ? (bufferGroup) : (DE_NULL));

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET);
		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}